

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_454b0e::TransformSelectorAt::Validate(TransformSelectorAt *this,size_t count)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar2;
  int local_50;
  int local_4c;
  iterator iStack_48;
  int index;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> indexes;
  size_t count_local;
  TransformSelectorAt *this_local;
  
  indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)count;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&__range2);
  this_00 = &(this->super_TransformSelectorIndexes).Indexes;
  __end2 = std::vector<int,_std::allocator<int>_>::begin(this_00);
  iStack_48 = std::vector<int,_std::allocator<int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    local_4c = *piVar2;
    local_50 = TransformSelectorIndexes::NormalizeIndex
                         (&this->super_TransformSelectorIndexes,local_4c,
                          (size_t)indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&__range2,&local_50);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->super_TransformSelectorIndexes).Indexes,
             (vector<int,_std::allocator<int>_> *)&__range2);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__range2);
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    decltype(Indexes) indexes;

    for (auto index : Indexes) {
      indexes.push_back(this->NormalizeIndex(index, count));
    }
    this->Indexes = std::move(indexes);

    return true;
  }